

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

int ON_SolveCubicEquation(double a,double b,double c,double d,double *r1,double *r2,double *r3)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double __x;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double rr1;
  double rr0;
  double local_28;
  double local_20;
  
  if ((a != 0.0) || (NAN(a))) {
    uVar2 = -(uint)(a != 1.0) & 1;
    auVar11._8_8_ = b;
    auVar11._0_8_ = d;
    auVar12._8_4_ = SUB84(a,0);
    auVar12._0_8_ = a;
    auVar12._12_4_ = (int)((ulong)a >> 0x20);
    auVar12 = divpd(auVar11,auVar12);
    dVar5 = c / a;
    if ((a == 1.0) && (!NAN(a))) {
      dVar5 = c;
    }
    auVar7._0_8_ = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
    auVar7._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar7._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar13._0_8_ = auVar12._0_8_ & auVar7._0_8_;
    auVar13._8_8_ = auVar12._8_8_ & auVar7._8_8_;
    auVar8._0_8_ = ~auVar7._0_8_ & (ulong)d;
    auVar8._8_8_ = ~auVar7._8_8_ & (ulong)b;
    dVar6 = SUB168(auVar8 | auVar13,8);
    auVar9._0_8_ = SUB168(auVar8 | auVar13,0) * 27.0 +
                   dVar6 * -9.0 * dVar5 + (dVar6 + dVar6) * dVar6 * dVar6;
    auVar9._8_8_ = dVar6 * dVar6 + dVar5 * -3.0;
    auVar12 = divpd(auVar9,_DAT_006c1530);
    __x = auVar12._8_8_;
    dVar4 = auVar12._0_8_;
    dVar5 = __x * __x * __x;
    if (dVar4 * dVar4 < dVar5) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = acos(dVar4 / dVar5);
      dVar4 = SQRT(__x);
      dVar10 = dVar4;
      if (__x < 0.0) {
        dVar10 = sqrt(__x);
      }
      dVar1 = cos(dVar5 / 3.0);
      dVar6 = dVar6 / -3.0;
      *r1 = dVar1 * dVar10 * -2.0 + dVar6;
      dVar10 = dVar4;
      if (__x < 0.0) {
        dVar10 = sqrt(__x);
      }
      dVar1 = cos((dVar5 + 6.283185307179586) / 3.0);
      *r2 = dVar1 * dVar10 * -2.0 + dVar6;
      if (__x < 0.0) {
        dVar4 = sqrt(__x);
      }
      dVar5 = cos((dVar5 + -6.283185307179586) / 3.0);
      dVar6 = dVar5 * dVar4 * -2.0 + dVar6;
      *r3 = dVar6;
      dVar5 = *r1;
      dVar4 = *r2;
      if (dVar4 < dVar5) {
        *r1 = dVar4;
        *r2 = dVar5;
        dVar6 = *r3;
        dVar4 = dVar5;
      }
      if (dVar6 < dVar4) {
        *r2 = dVar6;
        *r3 = dVar4;
        dVar4 = *r2;
      }
      dVar5 = *r1;
      if (dVar5 <= dVar4) {
        return 3;
      }
      *r1 = dVar4;
      *r2 = dVar5;
      return 3;
    }
    dVar5 = dVar4 * dVar4 - dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar5 = pow(ABS(dVar4) + dVar5,0.3333333333333333);
    dVar10 = (double)(-(ulong)(0.0 < dVar4) & (ulong)-dVar5 | ~-(ulong)(0.0 < dVar4) & (ulong)dVar5)
    ;
    dVar4 = (double)(-(ulong)(-dVar5 != dVar5) & (ulong)(__x / dVar10));
    dVar5 = dVar10 + dVar4;
    *r1 = dVar5 - dVar6 / 3.0;
    *r2 = dVar5 * -0.5 - dVar6 / 3.0;
    *r3 = (dVar10 - dVar4) * 1.224744871391589;
  }
  else {
    if ((b != 0.0) || (NAN(b))) {
      uVar2 = ON_SolveQuadraticEquation(b,c,d,&local_20,&local_28);
      iVar3 = 2;
      if (1 < uVar2) {
        if (uVar2 != 2) {
          return 0;
        }
        iVar3 = 0;
      }
      *r1 = local_20;
      *r2 = local_28;
      return iVar3;
    }
    if ((c == 0.0) && (!NAN(c))) {
      return -1;
    }
    *r1 = -d / c;
  }
  return 1;
}

Assistant:

int ON_SolveCubicEquation(
  double a, double b, double c, double d,
  double* r1, double* r2, double* r3
)
{
  int rc = 0;
  if (a == 0.0)
  {
    if (b == 0.0)
    {
      if (c == 0.0)
      {
        // no roots
        rc = -1;
      }
      else
      {
        // linear equation
        *r1 = -d / c;
        rc = 1;
      }
    }
    else
    {
      // quadratic equation
      double rr0, rr1;
      int qrc = ON_SolveQuadraticEquation(b, c, d, &rr0, &rr1);
      switch (qrc)
      {
      case 0:
        // two distinct real roots (rr0 < rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 1:
        // one real root (rr0 = rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 2:
        // 2: two complex conjugate roots (rr0 +/- (rr1)*sqrt(-1))
        *r1 = rr0;
        *r2 = rr1;
        rc = 0;
        break;
      }
    }
  }
  else
  {
    if (a != 1.0)
    {
      // convert to normal form equation
      b = b / a;
      c = c / a;
      d = d / a;
      a = 1.0;
    }

    double Q = (b*b - 3.0 * c) / 9.0;
    double R = (2.0 * b*b*b - 9.0* b* c + 27.0 * d) / 54.0;

    if (R*R < Q*Q*Q)
    {
      // three real roots
      double Theta = acos(R / sqrt(Q*Q*Q));
      *r1 = -2.0 * sqrt(Q) * cos(Theta / 3.0) - b / 3.0;
      *r2 = -2.0 * sqrt(Q) * cos((Theta + 2.0*ON_PI) / 3.0) - b / 3.0;
      *r3 = -2.0 * sqrt(Q) * cos((Theta - 2.0*ON_PI) / 3.0) - b / 3.0;
      // inline bubble sort 
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      if (*r2 > *r3) { double temp = *r2; *r2 = *r3; *r3 = temp; }
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      rc = 3;
    }
    else
    {
      double A = pow(fabs(R) + sqrt(R*R - Q * Q*Q), 1.0 / 3.0);
      if (R > 0)
        A = -A;
      double B = 0;
      if (A != 0.0)
        B = Q / A;
      *r1 = (A + B) - b / 3;
      // the complex congate pair of roots are r2 +/- r3 i
      *r2 = -(A + B) / 2.0 - b / 3;
      *r3 = sqrt(3.0 / 2.0)*(A - B);
      rc = 1;
    }
  }
  return rc;
}